

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  RgbaChannels RVar4;
  Header *pHVar5;
  int *piVar6;
  undefined4 *puVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  allocator<char> local_e1;
  char *local_e0;
  AcesInputFile in;
  Array2D<Imf_3_4::Rgba> p;
  undefined8 local_98 [4];
  char **local_78;
  long local_70;
  Header h;
  
  if (1 < argc) {
    local_e0 = (char *)0x0;
    bVar2 = false;
    pcVar8 = (char *)0x0;
    for (uVar12 = 1; (uint)argc != uVar12; uVar12 = uVar12 + 1) {
      __s1 = argv[uVar12];
      if (*__s1 == '-') {
        if ((__s1[1] != 'v') || (__s1[2] != '\0')) {
          if ((__s1[1] == 'h') && (__s1[2] == '\0')) goto LAB_00102437;
          goto LAB_001023eb;
        }
        bVar2 = true;
        __s1 = local_e0;
      }
      else {
LAB_001023eb:
        iVar3 = strcmp(__s1,"--help");
        if (iVar3 == 0) {
LAB_00102437:
          anon_unknown.dwarf_3a7d::usageMessage((ostream *)&std::cout,"exr2aces",true);
          return 0;
        }
        iVar3 = strcmp(__s1,"--version");
        if (iVar3 == 0) {
          pcVar8 = (char *)Imf_3_4::getLibraryVersion();
          poVar9 = std::operator<<((ostream *)&std::cout,"exr2aces (OpenEXR) ");
          std::operator<<(poVar9,"3.4.0");
          iVar3 = strcmp(pcVar8,"3.4.0");
          if (iVar3 != 0) {
            poVar9 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
            poVar9 = std::operator<<(poVar9,pcVar8);
            std::operator<<(poVar9,")");
          }
          poVar9 = std::operator<<((ostream *)&std::cout," https://openexr.com");
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "Copyright (c) Contributors to the OpenEXR Project");
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
          std::endl<char,std::char_traits<char>>(poVar9);
          return 0;
        }
        if (pcVar8 == (char *)0x0) {
          pcVar8 = __s1;
          __s1 = local_e0;
        }
      }
      local_e0 = __s1;
    }
    if (local_e0 != (char *)0x0 && pcVar8 != (char *)0x0) {
      p._sizeX = 0;
      p._sizeY = 0;
      p._data = (Rgba *)0x0;
      local_98[0] = 0;
      local_78 = argv;
      Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&h,0x40,0x40,local_98,0,3);
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Reading file ");
        poVar9 = std::operator<<(poVar9,pcVar8);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar8,&local_e1);
      iVar3 = Imf_3_4::globalThreadCount();
      Imf_3_4::AcesInputFile::AcesInputFile(&in,(string *)local_98,iVar3);
      std::__cxx11::string::~string((string *)local_98);
      pHVar5 = (Header *)Imf_3_4::AcesInputFile::header();
      Imf_3_4::Header::operator=(&h,pHVar5);
      RVar4 = Imf_3_4::AcesInputFile::channels();
      piVar6 = (int *)Imf_3_4::Header::dataWindow();
      lVar11 = (long)*piVar6;
      iVar3 = piVar6[1];
      uVar1 = piVar6[2];
      local_70 = ((long)piVar6[3] - (long)iVar3) + 1;
      Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase(&p,local_70,(long)(int)((uVar1 - *piVar6) + 1));
      lVar10 = ((int)~uVar1 + lVar11) * (long)iVar3;
      Imf_3_4::AcesInputFile::setFrameBuffer((Rgba *)&in,(ulong)(p._data + (lVar10 - lVar11)),1);
      Imf_3_4::AcesInputFile::readPixels((int)&in,iVar3);
      Imf_3_4::AcesInputFile::~AcesInputFile(&in);
      piVar6 = (int *)Imf_3_4::Header::compression();
      if (*piVar6 - 6U < 2) {
        puVar7 = (undefined4 *)Imf_3_4::Header::compression();
        *puVar7 = 7;
      }
      else if (*piVar6 != 0) {
        puVar7 = (undefined4 *)Imf_3_4::Header::compression();
        *puVar7 = 4;
      }
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Writing file ");
        poVar9 = std::operator<<(poVar9,local_e0);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_98,local_e0,&local_e1);
      iVar3 = Imf_3_4::globalThreadCount();
      Imf_3_4::AcesOutputFile::AcesOutputFile
                ((AcesOutputFile *)&in,(string *)local_98,&h,RVar4,iVar3);
      std::__cxx11::string::~string((string *)local_98);
      Imf_3_4::AcesOutputFile::setFrameBuffer((Rgba *)&in,(ulong)(p._data + (lVar10 - lVar11)),1);
      Imf_3_4::AcesOutputFile::writePixels((int)&in);
      Imf_3_4::AcesOutputFile::~AcesOutputFile((AcesOutputFile *)&in);
      Imf_3_4::Header::~Header(&h);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p);
      return 0;
    }
  }
  anon_unknown.dwarf_3a7d::usageMessage((ostream *)&std::cerr,*argv,false);
  return -1;
}

Assistant:

int
main (int argc, char** argv)
{
    const char* inFile  = 0;
    const char* outFile = 0;
    bool        verbose = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    int i = 1;

    while (i < argc)
    {
        if (!strcmp (argv[i], "-v"))
        {
            //
            // Verbose mode
            //

            verbose = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            //
            // Print help message
            //

            usageMessage (cout, "exr2aces", true);
            return 0;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exr2aces (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;

            return 0;
        }
        else
        {
            //
            // Image file name
            //

            if (inFile == 0)
                inFile = argv[i];
            else
                outFile = argv[i];

            i += 1;
        }
    }

    if (inFile == 0 || outFile == 0)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    //
    // Load inFile, and save a tiled version in outFile.
    //

    try
    {
        exr2aces (inFile, outFile, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ":  " << e.what () << endl;
        return 1;
    }

    return 0;
}